

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O0

void rt_Translate1col(BYTE *translation,int hx,int yl,int yh)

{
  byte bVar1;
  uint uVar2;
  BYTE b1;
  BYTE b0;
  int c1;
  int c0;
  int count8;
  BYTE *source;
  int count;
  int yh_local;
  int yl_local;
  int hx_local;
  BYTE *translation_local;
  
  uVar2 = (yh - yl) + 1;
  _c0 = dc_temp + (yl * 4 + hx);
  for (c1 = (int)uVar2 >> 3; c1 != 0; c1 = c1 + -1) {
    bVar1 = translation[(int)(uint)_c0[4]];
    *_c0 = translation[(int)(uint)*_c0];
    _c0[4] = bVar1;
    bVar1 = translation[(int)(uint)_c0[0xc]];
    _c0[8] = translation[(int)(uint)_c0[8]];
    _c0[0xc] = bVar1;
    bVar1 = translation[(int)(uint)_c0[0x14]];
    _c0[0x10] = translation[(int)(uint)_c0[0x10]];
    _c0[0x14] = bVar1;
    bVar1 = translation[(int)(uint)_c0[0x1c]];
    _c0[0x18] = translation[(int)(uint)_c0[0x18]];
    _c0[0x1c] = bVar1;
    _c0 = _c0 + 0x20;
  }
  for (source._0_4_ = uVar2 & 7; (uint)source != 0; source._0_4_ = (uint)source - 1) {
    *_c0 = translation[*_c0];
    _c0 = _c0 + 4;
  }
  return;
}

Assistant:

void rt_Translate1col(const BYTE *translation, int hx, int yl, int yh)
{
	int count = yh - yl + 1;
	BYTE *source = &dc_temp[yl*4 + hx];

	// Things we do to hit the compiler's optimizer with a clue bat:
	// 1. Parallelism is explicitly spelled out by using a separate
	//    C instruction for each assembly instruction. GCC lets me
	//    have four temporaries, but VC++ spills to the stack with
	//    more than two. Two is probably optimal, anyway.
	// 2. The results of the translation lookups are explicitly
	//    stored in byte-sized variables. This causes the VC++ code
	//    to use byte mov instructions in most cases; for apparently
	//    random reasons, it will use movzx for some places. GCC
	//    ignores this and uses movzx always.

	// Do 8 rows at a time.
	for (int count8 = count >> 3; count8; --count8)
	{
		int c0, c1;
		BYTE b0, b1;

		c0 = source[0];			c1 = source[4];
		b0 = translation[c0];	b1 = translation[c1];
		source[0] = b0;			source[4] = b1;

		c0 = source[8];			c1 = source[12];
		b0 = translation[c0];	b1 = translation[c1];
		source[8] = b0;			source[12] = b1;

		c0 = source[16];		c1 = source[20];
		b0 = translation[c0];	b1 = translation[c1];
		source[16] = b0;		source[20] = b1;

		c0 = source[24];		c1 = source[28];
		b0 = translation[c0];	b1 = translation[c1];
		source[24] = b0;		source[28] = b1;

		source += 32;
	}
	// Finish by doing 1 row at a time.
	for (count &= 7; count; --count, source += 4)
	{
		source[0] = translation[source[0]];
	}
}